

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebur128.c
# Opt level: O2

int ebur128_set_max_window(ebur128_state *st,unsigned_long window)

{
  uint uVar1;
  ebur128_state_internal *peVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double *pdVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  
  uVar11 = 3000;
  if (2999 < window || (~st->mode & 3U) != 0) {
    uVar11 = 400;
    if (400 < window) {
      uVar11 = window;
    }
    if ((st->mode & 1U) == 0) {
      uVar11 = window;
    }
  }
  peVar2 = st->d;
  if (uVar11 == peVar2->window) {
    iVar10 = 4;
  }
  else {
    uVar8 = st->samplerate;
    iVar10 = 1;
    if (((uVar8 == 0) || ((uVar8 | uVar11) >> 0x20 == 0)) ||
       (auVar4._8_8_ = 0, auVar4._0_8_ = uVar8, auVar6._8_8_ = 0, auVar6._0_8_ = uVar11,
       SUB168(auVar4 * auVar6,8) == 0)) {
      uVar8 = uVar8 * uVar11;
      uVar3 = peVar2->samples_in_100ms;
      if (!CARRY8(uVar3,uVar8)) {
        uVar12 = (uVar3 + uVar8) - uVar8 % uVar3;
        if (uVar8 % uVar3 == 0) {
          uVar12 = uVar8;
        }
        uVar8 = (ulong)st->channels * 8;
        if (((uVar12 == 0) || ((uVar8 | uVar12) >> 0x20 == 0)) ||
           (auVar5._8_8_ = 0, auVar5._0_8_ = uVar12,
           SUB168(auVar5 * ZEXT416(st->channels) * (undefined1  [16])0x8,8) == 0)) {
          pdVar7 = (double *)malloc(uVar8 * uVar12);
          if (pdVar7 != (double *)0x0) {
            peVar2->window = uVar11;
            free(peVar2->audio_data);
            peVar2 = st->d;
            peVar2->audio_data = pdVar7;
            peVar2->audio_data_frames = uVar12;
            uVar1 = st->channels;
            for (lVar9 = 0; uVar1 * uVar12 - lVar9 != 0; lVar9 = lVar9 + 1) {
              pdVar7[lVar9] = 0.0;
            }
            peVar2->needed_frames = peVar2->samples_in_100ms << 2;
            peVar2->audio_data_index = 0;
            peVar2->short_term_frame_counter = 0;
            iVar10 = 0;
          }
        }
      }
    }
  }
  return iVar10;
}

Assistant:

int ebur128_set_max_window(ebur128_state* st, unsigned long window) {
  int errcode = EBUR128_SUCCESS;
  size_t j;

  if ((st->mode & EBUR128_MODE_S) == EBUR128_MODE_S && window < 3000) {
    window = 3000;
  } else if ((st->mode & EBUR128_MODE_M) == EBUR128_MODE_M && window < 400) {
    window = 400;
  }

  if (window == st->d->window) {
    return EBUR128_ERROR_NO_CHANGE;
  }

  size_t new_audio_data_frames;
  if (safe_size_mul(st->samplerate, window, &new_audio_data_frames) != 0 ||
      new_audio_data_frames > ((size_t) -1) - st->d->samples_in_100ms) {
    return EBUR128_ERROR_NOMEM;
  }
  if (new_audio_data_frames % st->d->samples_in_100ms) {
    /* round up to multiple of samples_in_100ms */
    new_audio_data_frames = (new_audio_data_frames + st->d->samples_in_100ms) -
                            (new_audio_data_frames % st->d->samples_in_100ms);
  }

  size_t new_audio_data_size;
  if (safe_size_mul(new_audio_data_frames, st->channels * sizeof(double),
                    &new_audio_data_size) != 0) {
    return EBUR128_ERROR_NOMEM;
  }

  double* new_audio_data = (double*) malloc(new_audio_data_size);
  CHECK_ERROR(!new_audio_data, EBUR128_ERROR_NOMEM, exit)

  st->d->window = window;
  free(st->d->audio_data);
  st->d->audio_data = new_audio_data;
  st->d->audio_data_frames = new_audio_data_frames;
  for (j = 0; j < st->d->audio_data_frames * st->channels; ++j) {
    st->d->audio_data[j] = 0.0;
  }

  /* the first block needs 400ms of audio data */
  st->d->needed_frames = st->d->samples_in_100ms * 4;
  /* start at the beginning of the buffer */
  st->d->audio_data_index = 0;
  /* reset short term frame counter */
  st->d->short_term_frame_counter = 0;

exit:
  return errcode;
}